

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O1

void __thiscall CMU462::DynamicScene::Mesh::draw_pretty(Mesh *this)

{
  list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *plVar1;
  float fVar2;
  _List_node_base *p_Var3;
  double *pdVar4;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> offsets;
  Vector3D offset;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> local_78;
  value_type local_60;
  Vector3D local_48;
  
  local_78.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  plVar1 = &(this->mesh).vertices;
  p_Var3 = (this->mesh).vertices.super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  if (p_Var3 != (_List_node_base *)plVar1) {
    do {
      fVar2 = *(float *)((long)&p_Var3[6]._M_prev + 4);
      Vertex::normal(&local_48,(Vertex *)(p_Var3 + 1));
      local_60.z = (double)fVar2;
      local_60.x = local_48.x * local_60.z;
      local_60.y = local_48.y * local_60.z;
      local_60.z = local_60.z * local_48.z;
      std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::push_back
                (&local_78,&local_60);
      p_Var3 = p_Var3->_M_next;
    } while (p_Var3 != (_List_node_base *)plVar1);
  }
  p_Var3 = (plVar1->super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>)._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var3 != (_List_node_base *)plVar1) {
    pdVar4 = &(local_78.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
               _M_impl.super__Vector_impl_data._M_start)->z;
    do {
      p_Var3[1]._M_prev =
           (_List_node_base *)(((Vector3D *)(pdVar4 + -2))->x + (double)p_Var3[1]._M_prev);
      p_Var3[2]._M_next = (_List_node_base *)(pdVar4[-1] + (double)p_Var3[2]._M_next);
      p_Var3[2]._M_prev = (_List_node_base *)(*pdVar4 + (double)p_Var3[2]._M_prev);
      p_Var3 = p_Var3->_M_next;
      pdVar4 = pdVar4 + 3;
    } while (p_Var3 != (_List_node_base *)plVar1);
  }
  glPushMatrix();
  glTranslatef((float)(this->super_SceneObject).position.x,
               (float)(this->super_SceneObject).position.y,
               (float)(this->super_SceneObject).position.z);
  glRotatef((float)(this->super_SceneObject).rotation.x,0x3f800000,0,0);
  glRotatef((float)(this->super_SceneObject).rotation.y,0,0x3f800000,0);
  glRotatef((float)(this->super_SceneObject).rotation.z,0,0,0x3f800000);
  glScalef((float)(this->super_SceneObject).scale.x,(float)(this->super_SceneObject).scale.y,
           (float)(this->super_SceneObject).scale.z);
  if (this->bsdf == (BSDF *)0x0) {
    glBindTexture(0xde1,0);
    local_60.x = 0.007812501848093234;
    local_60.y = (double)CONCAT44(local_60.y._4_4_,0x3f800000);
    glMaterialfv(0x404,0x1201);
  }
  else {
    glBindTexture(0xde1,0);
    glMaterialfv(0x404,0x1201,&this->bsdf->rasterize_color);
  }
  glEnable(0xb50);
  glDisable(0xbe2);
  draw_faces(this,true);
  glPopMatrix();
  p_Var3 = (plVar1->super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>)._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var3 != (_List_node_base *)plVar1) {
    pdVar4 = &(local_78.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
               _M_impl.super__Vector_impl_data._M_start)->z;
    do {
      p_Var3[1]._M_prev =
           (_List_node_base *)((double)p_Var3[1]._M_prev - ((Vector3D *)(pdVar4 + -2))->x);
      p_Var3[2]._M_next = (_List_node_base *)((double)p_Var3[2]._M_next - pdVar4[-1]);
      p_Var3[2]._M_prev = (_List_node_base *)((double)p_Var3[2]._M_prev - *pdVar4);
      p_Var3 = p_Var3->_M_next;
      pdVar4 = pdVar4 + 3;
    } while (p_Var3 != (_List_node_base *)plVar1);
  }
  if (local_78.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Mesh::draw_pretty() {

  vector<Vector3D> offsets;

  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    Vector3D offset = v->offset * v->normal();
    offsets.push_back(offset);
  }

  int i = 0;
  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    v->position += offsets[i++];
  }

  glPushMatrix();
  glTranslatef(position.x, position.y, position.z);
  glRotatef(rotation.x, 1.0f, 0.0f, 0.0f);
  glRotatef(rotation.y, 0.0f, 1.0f, 0.0f);
  glRotatef(rotation.z, 0.0f, 0.0f, 1.0f);
  glScalef(scale.x, scale.y, scale.z);

  if (bsdf) {
    glBindTexture(GL_TEXTURE_2D, 0);
    glMaterialfv(GL_FRONT, GL_DIFFUSE, &bsdf->rasterize_color.r);
  } else {
    glBindTexture(GL_TEXTURE_2D, 0);
    Spectrum white = Spectrum(1., 1., 1.);
    glMaterialfv(GL_FRONT, GL_DIFFUSE, &white.r);
  }

	// Enable lighting for faces
  glEnable(GL_LIGHTING);
  glDisable(GL_BLEND);
  draw_faces(true);

  glPopMatrix();

  i = 0;
  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    v->position -= offsets[i++];
  }
}